

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSat.c
# Opt level: O2

void Cec2_ManDestroy(Cec2_Man_t *p)

{
  long lVar1;
  abctime aVar2;
  long lVar3;
  long lVar4;
  int level;
  Cec2_Man_t *pCVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  
  if (p->pPars->fVerbose != 0) {
    pCVar5 = p;
    aVar2 = Abc_Clock();
    level = (int)pCVar5;
    lVar4 = p->timeSatUnsat + p->timeSatSat + p->timeSatUndec;
    lVar1 = p->timeStart;
    dVar6 = 0.0;
    lVar3 = aVar2 - lVar1;
    dVar8 = (double)lVar3;
    if (lVar3 != 0) {
      dVar6 = (dVar8 * 100.0) / dVar8;
    }
    dVar9 = (double)lVar4;
    dVar11 = 0.0;
    if (aVar2 != lVar1) {
      dVar11 = (dVar9 * 100.0) / dVar8;
    }
    dVar7 = (double)(lVar3 - (p->timeSim + lVar4 + p->timeRefine + p->timeExtra));
    dVar10 = 0.0;
    if (aVar2 != lVar1) {
      dVar10 = (dVar7 * 100.0) / dVar8;
    }
    Abc_Print(level,"%s =","SAT solving");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar9 / 1000000.0,dVar11);
    Abc_Print(level,"%s =","  sat      ");
    dVar9 = 0.0;
    if (aVar2 != lVar1) {
      dVar9 = ((double)p->timeSatSat * 100.0) / dVar8;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatSat / 1000000.0,dVar9);
    Abc_Print(level,"%s =","  unsat    ");
    dVar9 = 0.0;
    if (aVar2 != lVar1) {
      dVar9 = ((double)p->timeSatUnsat * 100.0) / dVar8;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUnsat / 1000000.0,dVar9);
    Abc_Print(level,"%s =","  fail     ");
    dVar9 = 0.0;
    if (aVar2 != lVar1) {
      dVar9 = ((double)p->timeSatUndec * 100.0) / dVar8;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSatUndec / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Simulation ");
    dVar9 = 0.0;
    if (aVar2 != lVar1) {
      dVar9 = ((double)p->timeSim * 100.0) / dVar8;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeSim / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Refinement ");
    dVar9 = 0.0;
    if (aVar2 != lVar1) {
      dVar9 = ((double)p->timeRefine * 100.0) / dVar8;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeRefine / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Rollback   ");
    dVar9 = 0.0;
    if (aVar2 != lVar1) {
      dVar9 = ((double)p->timeExtra * 100.0) / dVar8;
    }
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",(double)p->timeExtra / 1000000.0,dVar9);
    Abc_Print(level,"%s =","Other      ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar7 / 1000000.0,dVar10);
    Abc_Print(level,"%s =","TOTAL      ");
    Abc_Print(level,"%9.2f sec (%6.2f %%)\n",dVar8 / 1000000.0,dVar6);
    fflush(_stdout);
  }
  Vec_WrdFreeP(&p->pAig->vSims);
  Gia_ManCleanMark01(p->pAig);
  satoko_destroy(p->pSat);
  Gia_ManStopP(&p->pNew);
  Vec_PtrFreeP(&p->vFrontier);
  Vec_PtrFreeP(&p->vFanins);
  Vec_IntFreeP(&p->vNodesNew);
  Vec_IntFreeP(&p->vSatVars);
  Vec_IntFreeP(&p->vObjSatPairs);
  Vec_IntFreeP(&p->vCexTriples);
  free(p);
  return;
}

Assistant:

void Cec2_ManDestroy( Cec2_Man_t * p )
{
    if ( p->pPars->fVerbose ) 
    {
        abctime timeTotal = Abc_Clock() - p->timeStart;
        abctime timeSat   = p->timeSatSat + p->timeSatUnsat + p->timeSatUndec;
        abctime timeOther = timeTotal - timeSat - p->timeSim - p->timeRefine - p->timeExtra;
//        Abc_Print( 1, "%d\n", p->Num );
        ABC_PRTP( "SAT solving", timeSat,          timeTotal );
        ABC_PRTP( "  sat      ", p->timeSatSat,    timeTotal );
        ABC_PRTP( "  unsat    ", p->timeSatUnsat,  timeTotal );
        ABC_PRTP( "  fail     ", p->timeSatUndec,  timeTotal );
        ABC_PRTP( "Simulation ", p->timeSim,       timeTotal );
        ABC_PRTP( "Refinement ", p->timeRefine,    timeTotal );
        ABC_PRTP( "Rollback   ", p->timeExtra,     timeTotal );
        ABC_PRTP( "Other      ", timeOther,        timeTotal );
        ABC_PRTP( "TOTAL      ", timeTotal,        timeTotal );
        fflush( stdout );
    }

    Vec_WrdFreeP( &p->pAig->vSims );
    //Vec_WrdFreeP( &p->pAig->vSimsPi );
    Gia_ManCleanMark01( p->pAig );
    satoko_destroy( p->pSat );
    Gia_ManStopP( &p->pNew );
    Vec_PtrFreeP( &p->vFrontier );
    Vec_PtrFreeP( &p->vFanins );
    Vec_IntFreeP( &p->vNodesNew );
    Vec_IntFreeP( &p->vSatVars );
    Vec_IntFreeP( &p->vObjSatPairs );
    Vec_IntFreeP( &p->vCexTriples );
    ABC_FREE( p );
}